

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O2

bool option::Parser::workhorse
               (bool gnu,Descriptor *usage,int numargs,char **args,Action *action,
               bool single_minus_longopt,bool print_errors,int min_abbr_len)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  byte bVar4;
  bool bVar5;
  ArgStatus AVar6;
  int i1;
  int iVar7;
  char *pcVar8;
  char **ppcVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Descriptor *ctx;
  char *st2;
  char **ppcVar14;
  bool bVar15;
  Option option;
  char *local_b0;
  int local_a8;
  Option local_60;
  
  if (args == (char **)0x0) {
    numargs = 0;
  }
  iVar11 = 0;
LAB_00111ac9:
  iVar13 = 0;
  if (numargs != 0) {
    local_b0 = *args;
    if (local_b0 != (char *)0x0) {
      local_a8 = numargs;
      if (*local_b0 == '-') {
        cVar3 = local_b0[1];
        if (cVar3 == '-') {
          if (local_b0[2] != '\0') goto LAB_00111b0e;
          shift(args,iVar11);
          args = args + 1;
          numargs = numargs - (uint)(0 < numargs);
          goto LAB_00111e15;
        }
        if (cVar3 != '\0') {
LAB_00111b0e:
          bVar15 = cVar3 != '-';
          bVar4 = single_minus_longopt;
          st2 = local_b0 + 2;
          if (bVar15) {
            st2 = local_b0 + 1;
          }
LAB_00111b4a:
          iVar13 = 0;
          ppcVar9 = &usage->longopt;
          iVar12 = iVar13;
          if ((~bVar4 & bVar15) == 0) {
            for (; *ppcVar9 != (char *)0x0; ppcVar9 = ppcVar9 + 5) {
              bVar5 = streq(*ppcVar9,st2);
              if (bVar5) {
                bVar5 = *ppcVar9 == (char *)0x0;
                goto LAB_00111b87;
              }
              iVar12 = iVar12 + 1;
            }
            bVar5 = true;
LAB_00111b87:
            iVar13 = iVar12;
            if ((0 < min_abbr_len) && (bVar5)) {
              iVar7 = 0;
              ppcVar9 = &usage[1].longopt;
              for (ppcVar14 = &usage->longopt; *ppcVar14 != (char *)0x0; ppcVar14 = ppcVar14 + 5) {
                bVar5 = streqabbr(*ppcVar14,st2,(ulong)(uint)min_abbr_len);
                if (bVar5) {
                  if (*ppcVar14 != (char *)0x0) goto LAB_00111bd5;
                  break;
                }
                iVar7 = iVar7 + 1;
                ppcVar9 = ppcVar9 + 5;
              }
            }
            goto LAB_00111c0d;
          }
LAB_00111c49:
          pcVar8 = (char *)0x0;
          goto LAB_00111c4b;
        }
      }
      if (!gnu) goto LAB_00111e15;
      iVar11 = iVar11 + 1;
      goto LAB_00111de4;
    }
LAB_00111e15:
    if (numargs < 1) {
      if (numargs < 0) {
        lVar10 = 0;
        do {
          ppcVar9 = args + lVar10;
          lVar10 = lVar10 + 1;
        } while (*ppcVar9 != (char *)0x0);
        iVar13 = (int)lVar10 + -1;
      }
    }
    else {
      iVar13 = numargs;
      if (*args == (char *)0x0) {
        iVar13 = 0;
      }
    }
  }
  iVar11 = (*action->_vptr_Action[1])(action,(ulong)(uint)(iVar13 + iVar11),args + -(long)iVar11);
  return (bool)(char)iVar11;
  while( true ) {
    bVar5 = streqabbr(*ppcVar14,st2,(ulong)(uint)min_abbr_len);
    ppcVar9 = ppcVar14 + 5;
    if (bVar5) break;
LAB_00111bd5:
    ppcVar14 = ppcVar9;
    iVar13 = iVar7;
    if (*ppcVar14 == (char *)0x0) goto LAB_00111c0d;
  }
  iVar13 = iVar12;
  if (*ppcVar14 == (char *)0x0) {
    iVar13 = iVar7;
  }
LAB_00111c0d:
  pcVar1 = st2;
  if (usage[iVar13].longopt != (char *)0x0) {
    bVar15 = false;
  }
  do {
    pcVar8 = pcVar1 + 1;
    cVar3 = *pcVar1;
    if (cVar3 == '\0') {
      if (numargs == 1) goto LAB_00111c49;
      pcVar8 = args[1];
      break;
    }
    pcVar1 = pcVar8;
  } while (cVar3 != '=');
LAB_00111c4b:
  if (bVar15 != false) {
    if (local_b0[1] == '\0') goto LAB_00111dcb;
    pcVar1 = local_b0 + 1;
    iVar13 = 0;
    ppcVar9 = &usage->shortopt;
    while ((*ppcVar9 != (char *)0x0 && (bVar5 = instr(*pcVar1,*ppcVar9), !bVar5))) {
      iVar13 = iVar13 + 1;
      ppcVar9 = ppcVar9 + 5;
    }
    pcVar2 = local_b0 + 2;
    pcVar8 = local_b0 + 2;
    if (*pcVar2 == '\0') {
      pcVar8 = (char *)0x0;
    }
    local_b0 = pcVar1;
    if ((numargs != 1) && (*pcVar2 == '\0')) {
      pcVar8 = args[1];
    }
  }
  ctx = usage;
  if (usage[iVar13].shortopt == (char *)0x0) {
    for (; ctx->shortopt != (char *)0x0; ctx = ctx + 1) {
      if ((*ctx->shortopt == '\0') && (*ctx->longopt == '\0')) goto LAB_00111d0d;
    }
  }
  else {
    ctx = usage + iVar13;
LAB_00111d0d:
    Option::init(&local_60,(EVP_PKEY_CTX *)ctx);
    AVar6 = (*ctx->check_arg)(&local_60,print_errors);
    switch(AVar6) {
    case ARG_NONE:
    case ARG_IGNORE:
      local_60.arg = (char *)0x0;
      break;
    case ARG_OK:
      bVar15 = false;
      if ((numargs != 1) && (pcVar8 != (char *)0x0)) {
        if (pcVar8 == args[1]) {
          shift(args,iVar11);
          local_a8 = local_a8 - (uint)(0 < local_a8);
          bVar15 = false;
          args = args + 1;
        }
        else {
          bVar15 = false;
        }
      }
      break;
    case ARG_ILLEGAL:
      goto LAB_00111e56;
    }
    iVar13 = (**action->_vptr_Action)(action,&local_60);
    if ((char)iVar13 == '\0') {
LAB_00111e56:
      return false;
    }
  }
  bVar4 = 0;
  if (bVar15 == false) goto LAB_00111dcb;
  goto LAB_00111b4a;
LAB_00111dcb:
  shift(args,iVar11);
LAB_00111de4:
  numargs = local_a8 - (uint)(0 < local_a8);
  args = args + 1;
  goto LAB_00111ac9;
}

Assistant:

inline bool Parser::workhorse(bool gnu, const Descriptor usage[], int numargs, const char** args, Action& action,
                              bool single_minus_longopt, bool print_errors, int min_abbr_len)
{
  // protect against NULL pointer
  if (args == 0)
    numargs = 0;

  int nonops = 0;

  while (numargs != 0 && *args != 0)
  {
    const char* param = *args; // param can be --long-option, -srto or non-option argument

    // in POSIX mode the first non-option argument terminates the option list
    // a lone minus character is a non-option argument
    if (param[0] != '-' || param[1] == 0)
    {
      if (gnu)
      {
        ++nonops;
        ++args;
        if (numargs > 0)
          --numargs;
        continue;
      }
      else
        break;
    }

    // -- terminates the option list. The -- itself is skipped.
    if (param[1] == '-' && param[2] == 0)
    {
      shift(args, nonops);
      ++args;
      if (numargs > 0)
        --numargs;
      break;
    }

    bool handle_short_options;
    const char* longopt_name;
    if (param[1] == '-') // if --long-option
    {
      handle_short_options = false;
      longopt_name = param + 2;
    }
    else
    {
      handle_short_options = true;
      longopt_name = param + 1; //for testing a potential -long-option
    }

    bool try_single_minus_longopt = single_minus_longopt;
    bool have_more_args = (numargs > 1 || numargs < 0); // is referencing argv[1] valid?

    do // loop over short options in group, for long options the body is executed only once
    {
      int idx = 0;

      const char* optarg = 0;

      /******************** long option **********************/
      if (handle_short_options == false || try_single_minus_longopt)
      {
        idx = 0;
        while (usage[idx].longopt != 0 && !streq(usage[idx].longopt, longopt_name))
          ++idx;

        if (usage[idx].longopt == 0 && min_abbr_len > 0) // if we should try to match abbreviated long options
        {
          int i1 = 0;
          while (usage[i1].longopt != 0 && !streqabbr(usage[i1].longopt, longopt_name, min_abbr_len))
            ++i1;
          if (usage[i1].longopt != 0)
          { // now test if the match is unambiguous by checking for another match
            int i2 = i1 + 1;
            while (usage[i2].longopt != 0 && !streqabbr(usage[i2].longopt, longopt_name, min_abbr_len))
              ++i2;

            if (usage[i2].longopt == 0) // if there was no second match it's unambiguous, so accept i1 as idx
              idx = i1;
          }
        }

        // if we found something, disable handle_short_options (only relevant if single_minus_longopt)
        if (usage[idx].longopt != 0)
          handle_short_options = false;

        try_single_minus_longopt = false; // prevent looking for longopt in the middle of shortopt group

        optarg = longopt_name;
        while (*optarg != 0 && *optarg != '=')
          ++optarg;
        if (*optarg == '=') // attached argument
          ++optarg;
        else
          // possibly detached argument
          optarg = (have_more_args ? args[1] : 0);
      }

      /************************ short option ***********************************/
      if (handle_short_options)
      {
        if (*++param == 0) // point at the 1st/next option character
          break; // end of short option group

        idx = 0;
        while (usage[idx].shortopt != 0 && !instr(*param, usage[idx].shortopt))
          ++idx;

        if (param[1] == 0) // if the potential argument is separate
          optarg = (have_more_args ? args[1] : 0);
        else
          // if the potential argument is attached
          optarg = param + 1;
      }

      const Descriptor* descriptor = &usage[idx];

      if (descriptor->shortopt == 0) /**************  unknown option ********************/
      {
        // look for dummy entry (shortopt == "" and longopt == "") to use as Descriptor for unknown options
        idx = 0;
        while (usage[idx].shortopt != 0 && (usage[idx].shortopt[0] != 0 || usage[idx].longopt[0] != 0))
          ++idx;
        descriptor = (usage[idx].shortopt == 0 ? 0 : &usage[idx]);
      }

      if (descriptor != 0)
      {
        Option option(descriptor, param, optarg);
        switch (descriptor->check_arg(option, print_errors))
        {
          case ARG_ILLEGAL:
            return false; // fatal
          case ARG_OK:
            // skip one element of the argument vector, if it's a separated argument
            if (optarg != 0 && have_more_args && optarg == args[1])
            {
              shift(args, nonops);
              if (numargs > 0)
                --numargs;
              ++args;
            }

            // No further short options are possible after an argument
            handle_short_options = false;

            break;
          case ARG_IGNORE:
          case ARG_NONE:
            option.arg = 0;
            break;
        }

        if (!action.perform(option))
          return false;
      }

    } while (handle_short_options);

    shift(args, nonops);
    ++args;
    if (numargs > 0)
      --numargs;

  } // while

  if (numargs > 0 && *args == 0) // It's a bug in the caller if numargs is greater than the actual number
    numargs = 0; // of arguments, but as a service to the user we fix this if we spot it.

  if (numargs < 0) // if we don't know the number of remaining non-option arguments
  { // we need to count them
    numargs = 0;
    while (args[numargs] != 0)
      ++numargs;
  }

  return action.finished(numargs + nonops, args - nonops);
}